

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::SetRecordSets
          (Transfer_Control_Request_PDU *this,
          vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_> *RS)

{
  bool bVar1;
  KUINT16 KVar2;
  size_type sVar3;
  pointer this_00;
  __normal_iterator<KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
  local_38;
  __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_> *RS_local;
  Transfer_Control_Request_PDU *this_local;
  
  citr._M_current = (RecordSet *)RS;
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::clear
            (&this->m_vRecs);
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::operator=
            (&this->m_vRecs,
             (vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_> *)
             citr._M_current);
  sVar3 = std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::size
                    (&this->m_vRecs);
  this->m_ui32NumRecSets = (KUINT32)sVar3;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  citrEnd._M_current =
       (RecordSet *)
       std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::begin
                 (&this->m_vRecs);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::RecordSet_const*,std::vector<KDIS::DATA_TYPE::RecordSet,std::allocator<KDIS::DATA_TYPE::RecordSet>>>
  ::__normal_iterator<KDIS::DATA_TYPE::RecordSet*>
            ((__normal_iterator<KDIS::DATA_TYPE::RecordSet_const*,std::vector<KDIS::DATA_TYPE::RecordSet,std::allocator<KDIS::DATA_TYPE::RecordSet>>>
              *)&local_20,
             (__normal_iterator<KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
              *)&citrEnd);
  local_38._M_current =
       (RecordSet *)
       std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::end
                 (&this->m_vRecs);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::RecordSet_const*,std::vector<KDIS::DATA_TYPE::RecordSet,std::allocator<KDIS::DATA_TYPE::RecordSet>>>
  ::__normal_iterator<KDIS::DATA_TYPE::RecordSet*>
            ((__normal_iterator<KDIS::DATA_TYPE::RecordSet_const*,std::vector<KDIS::DATA_TYPE::RecordSet,std::allocator<KDIS::DATA_TYPE::RecordSet>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
              ::operator->(&local_20);
    KVar2 = DATA_TYPE::RecordSet::GetRecordLength(this_00);
    (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength =
         (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength +
         KVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Transfer_Control_Request_PDU::SetRecordSets( const vector<RecordSet> & RS )
{
    m_vRecs.clear();
    m_vRecs = RS;
    m_ui32NumRecSets = m_vRecs.size();

    // Calculate the PDU size
    m_ui16PDULength = TRANSFER_CONTROL_REQUEST_PDU_SIZE;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetRecordLength();
    }
}